

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int check_ascii_string(char *message,size_t max)

{
  char *pcVar1;
  ulong uVar2;
  
  if (message != (char *)0x0) {
    uVar2 = 0;
    do {
      pcVar1 = message + uVar2;
      if (*pcVar1 == '\0') {
        return 0;
      }
    } while ((uVar2 <= max) && (uVar2 = uVar2 + 1, 0xa0 < (byte)(*pcVar1 + 0x81U)));
  }
  return -2;
}

Assistant:

static int check_ascii_string(const char *message, size_t max)
{
    size_t index;

    if (!message)
        return WALLY_EINVAL;

    for (index = 0; message[index] != '\0'; ++index)
        if ((message[index] < 0x20) || (message[index] == 0x7f) || (index > max))
            return WALLY_EINVAL;

    return WALLY_OK;
}